

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

APInt __thiscall llvm::APInt::smul_ov(APInt *this,APInt *RHS,bool *Overflow)

{
  bool bVar1;
  undefined1 *in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  APInt AVar3;
  anon_union_8_2_1313ab2f_for_U local_50;
  uint local_48;
  anon_union_8_2_1313ab2f_for_U local_40;
  uint local_38;
  
  operator*(this,RHS);
  bVar1 = operator==(RHS,0);
  uVar2 = extraout_RDX;
  if (!bVar1) {
    bVar1 = operator==((APInt *)Overflow,0);
    uVar2 = extraout_RDX_00;
    if (!bVar1) {
      sdiv((APInt *)&local_50,this);
      bVar1 = operator==((APInt *)&local_50,RHS);
      if (bVar1) {
        sdiv((APInt *)&local_40,this);
        bVar1 = operator==((APInt *)&local_40,(APInt *)Overflow);
        *in_RCX = !bVar1;
        uVar2 = extraout_RDX_02;
        if ((0x40 < local_38) && ((void *)local_40.VAL != (void *)0x0)) {
          operator_delete__(local_40.pVal);
          uVar2 = extraout_RDX_03;
        }
      }
      else {
        *in_RCX = 1;
        uVar2 = extraout_RDX_01;
      }
      if ((0x40 < local_48) && ((void *)local_50.VAL != (void *)0x0)) {
        operator_delete__(local_50.pVal);
        uVar2 = extraout_RDX_04;
      }
      goto LAB_001844bf;
    }
  }
  *in_RCX = 0;
LAB_001844bf:
  AVar3._8_8_ = uVar2;
  AVar3.U.pVal = (uint64_t *)this;
  return AVar3;
}

Assistant:

APInt APInt::smul_ov(const APInt &RHS, bool &Overflow) const {
  APInt Res = *this * RHS;

  if (*this != 0 && RHS != 0)
    Overflow = Res.sdiv(RHS) != *this || Res.sdiv(*this) != RHS;
  else
    Overflow = false;
  return Res;
}